

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shlut.hpp
# Opt level: O3

void calculate_sh_lut(float *data,int size)

{
  ulong uVar1;
  float *pfVar2;
  int index;
  long lVar3;
  int face;
  long lVar4;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar5;
  float fVar6;
  float fVar7;
  vec3f d [6];
  float GU;
  float coeffs [225];
  float local_478 [18];
  long local_430;
  ulong local_428;
  float *local_420;
  ulong local_418;
  float *local_410;
  vec3f local_408;
  float local_3f8;
  float local_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  float local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined1 local_3c8 [16];
  float local_3b8 [226];
  
  if (0 < size) {
    local_3f8 = (float)size * 0.5;
    local_3e8 = -local_3f8;
    uStack_3e4 = in_XMM0_Db ^ 0x80000000;
    uStack_3e0 = in_XMM0_Dc ^ 0x80000000;
    uStack_3dc = in_XMM0_Dd ^ 0x80000000;
    uVar1 = (ulong)(uint)size;
    local_430 = uVar1 * 4;
    local_428 = 0;
    do {
      local_3d8 = ((float)(int)local_428 - local_3f8) + 0.5;
      local_3c8 = ZEXT416((uint)local_3d8);
      local_3d8 = -local_3d8;
      uStack_3d4 = 0x80000000;
      uStack_3d0 = 0x80000000;
      uStack_3cc = 0x80000000;
      local_418 = 0;
      local_420 = data;
      do {
        local_478[5] = ((float)(int)local_418 - local_3f8) + 0.5;
        local_478[0] = local_3f8;
        local_478[1] = local_3d8;
        local_478[2] = -local_478[5];
        local_478[3] = local_3e8;
        local_478[4] = local_3d8;
        local_478[6] = local_478[5];
        local_478[7] = local_3f8;
        local_478[8] = (float)local_3c8._0_4_;
        local_478[9] = local_478[5];
        local_478[10] = local_3e8;
        local_478[0xb] = local_3d8;
        local_478[0xc] = local_478[5];
        local_478[0xd] = local_3d8;
        local_478[0xe] = local_3f8;
        local_478[0xf] = -local_478[5];
        local_478[0x10] = local_3d8;
        local_478[0x11] = local_3e8;
        lVar4 = 0;
        local_410 = data;
        do {
          local_408.z = local_478[lVar4 * 3 + 2];
          fVar5 = (float)*(undefined8 *)(local_478 + lVar4 * 3);
          fVar6 = (float)((ulong)*(undefined8 *)(local_478 + lVar4 * 3) >> 0x20);
          fVar7 = 1.0 / SQRT(local_408.z * local_408.z + fVar5 * fVar5 + fVar6 * fVar6);
          local_408.z = local_408.z * fVar7;
          local_408.y = fVar7 * fVar6;
          local_408.x = fVar7 * fVar5;
          SHEvaluate(&local_408,0xe,local_3b8);
          lVar3 = 0;
          pfVar2 = data;
          do {
            *pfVar2 = local_3b8[lVar3];
            lVar3 = lVar3 + 1;
            pfVar2 = pfVar2 + uVar1 * uVar1 * 6;
          } while (lVar3 != 0xe1);
          lVar4 = lVar4 + 1;
          data = data + uVar1 * uVar1;
        } while (lVar4 != 6);
        local_418 = local_418 + 1;
        data = local_410 + 1;
      } while (local_418 != uVar1);
      local_428 = local_428 + 1;
      data = (float *)((long)local_420 + local_430);
    } while (local_428 != uVar1);
  }
  return;
}

Assistant:

void calculate_sh_lut(float* data, const int size)
// layout: SHindex, face, position, rgb
{
	// evaluate SH bases at different direction N
	for (int i = 0; i < size; i++)
	{
		for (int j = 0; j < size; j++)
		{
			float GU = size*0.5f;
			float u = (float)j - GU + 0.5f;
			float v = (float)i - GU + 0.5f;
			// corresponding direction on each face
			vec3f d[6] = {
				vec3f( GU,  -v,  -u),
				vec3f(-GU,  -v,   u),
				vec3f(  u,  GU,   v),
				vec3f(  u, -GU,  -v),
				vec3f(  u,  -v,  GU),
				vec3f( -u,  -v, -GU)
			};
			for (int face = 0; face < 6; face++)
			{
				float coeffs[N_COEFFS];
				vec3f N = normalized(d[face]);
				SHEvaluate(N, shorder-1, coeffs);
				// fill in data
				for(int index=0; index < N_COEFFS; ++index) {
					data[((index*6 + face) * size + i) * size + j] = coeffs[index];
				}
			}
		}
	}
}